

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O2

TValue * luaT_gettm(Table *events,TMS event,TString *ename)

{
  byte bVar1;
  TString *pTVar2;
  uint __line;
  TValue *n;
  char *__function;
  char *__file;
  char *__assertion;
  
  if (ename->tt != '\x04') {
    __assertion = "key->tt == ((4) | ((0) << 4))";
    __file = 
    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h";
    __function = "const TValue *luaH_getshortstr(Table *, TString *)";
    __line = 0x5a;
    goto LAB_00124ebc;
  }
  n = &events->node[events->hmask & ename->hash].i_val;
  if ((((Node *)n)->i_key).nk.tt_ == 0x8004) {
    pTVar2 = (TString *)(((Node *)n)->i_key).nk.value_.gc;
    bVar1 = pTVar2->tt;
    if ((bVar1 & 0xf) == 4) {
      if (bVar1 == 4) {
        if (pTVar2 != ename) goto LAB_00124e30;
        goto LAB_00124e4a;
      }
      __assertion = 
      "((((void) sizeof (((((((((k))->tt_)) & 0x0F)) == (4))) ? 1 : 0), __extension__ ({ if ((((((((k))->tt_)) & 0x0F)) == (4))) ; else __assert_fail (\"(((((((k))->tt_)) & 0x0F)) == (4))\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h\", 92, __extension__ __PRETTY_FUNCTION__); })), ((((void) sizeof (((((((k)->value_).gc)->tt) & 0x0F) == 4) ? 1 : 0), __extension__ ({ if ((((((k)->value_).gc)->tt) & 0x0F) == 4) ; else __assert_fail (\"(((((k)->value_).gc)->tt) & 0x0F) == 4\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h\", 92, __extension__ __PRETTY_FUNCTION__); })), (&((((union GCUnion *)((((k)->value_).gc))))->ts))))))->tt == ((4) | ((0) << 4))"
      ;
    }
    else {
      __assertion = "(((((k)->value_).gc)->tt) & 0x0F) == 4";
    }
    __file = 
    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h";
    __function = "const TValue *luaH_getshortstr(Table *, TString *)";
    __line = 0x5c;
  }
  else {
LAB_00124e30:
    if ((((Node *)n)->i_key).nk.next == 0) {
      n = &luaO_nilobject_;
    }
    else {
      n = luaH_getshortstr_continue(ename,(Node *)n);
    }
LAB_00124e4a:
    if (event < TM_ADD) {
      if ((((Node *)n)->i_val).tt_ == 0) {
        events->flags = events->flags | (byte)(1 << (event & (TM_N|TM_SUB)));
        n = (TValue *)(ulong)(uint)(0 << (event & (TM_N|TM_SUB)));
      }
      return n;
    }
    __assertion = "event <= TM_EQ";
    __file = "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c";
    __function = "const TValue *luaT_gettm(Table *, TMS, TString *)";
    __line = 0x3d;
  }
LAB_00124ebc:
  __assert_fail(__assertion,__file,__line,__function);
}

Assistant:

const TValue *luaT_gettm (Table *events, TMS event, TString *ename) {
  const TValue *tm = luaH_getshortstr(events, ename);
  lua_assert(event <= TM_EQ);
  if (ttisnil(tm)) {  /* no tag method? */
    events->flags |= cast_byte(1u<<event);  /* cache this fact */
    return NULL;
  }
  else return tm;
}